

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O1

boolean attack(monst *mtmp,schar dx,schar dy)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  permonst *ppVar5;
  int iVar6;
  level *lev;
  boolean bVar7;
  schar sVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  obj *poVar16;
  char *pcVar17;
  char *pcVar18;
  attack *paVar19;
  obj **ppoVar20;
  monst *pmVar21;
  bool bVar22;
  char *pcVar23;
  monst *pmVar24;
  byte bVar25;
  int tmp;
  uint uVar26;
  uchar uVar27;
  int tmp_1;
  ulong uVar28;
  int dhit;
  monst *local_1e0;
  int local_1d4;
  int local_1d0 [2];
  int sum [6];
  attack alt_attk;
  char buf [256];
  
  ppVar5 = mtmp->data;
  if ((mtmp != (monst *)0x0) && (mtmp->mtame != '\0')) {
    if (mtmp->wormno == '\0') {
      if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
         (((((u.uprops[0x1e].intrinsic != 0 ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
           ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
            (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((ppVar5->mflags3 & 0x200) == 0))))))
      goto LAB_002716f9;
LAB_002716a4:
      uVar11 = *(uint *)&mtmp->field_0x60;
      if (((uVar11 & 2) != 0) && ((u.uprops[0xc].intrinsic == 0 && (u.uprops[0xc].extrinsic == 0))))
      {
        if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_002716ec;
        goto LAB_002716f9;
      }
      if ((uVar11 & 0x280) != 0) goto LAB_002716f9;
LAB_002716ec:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_002716f9;
    }
    else {
      bVar7 = worm_known(level,mtmp);
      if (bVar7 != '\0') goto LAB_002716a4;
LAB_002716f9:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar16 = which_armor(mtmp,4), poVar16 == (obj *)0x0 ||
          (poVar16 = which_armor(mtmp,4), poVar16->otyp != 0x4f)))) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
              (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
              youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
          if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_00271831;
          iVar10 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
          if ((iVar10 < 0x41) || (u.uprops[0x42].intrinsic != 0)) goto LAB_0027185d;
          goto LAB_00271841;
        }
      }
      else {
LAB_00271831:
        if (u.uprops[0x42].intrinsic == 0) {
LAB_00271841:
          if ((u.uprops[0x42].extrinsic == 0) && (bVar7 = match_warn_of_mon(mtmp), bVar7 == '\0'))
          goto LAB_0027187f;
        }
      }
    }
LAB_0027185d:
    if ((((flags.safe_dog != '\0') && (u.uprops[0x1c].intrinsic == 0)) &&
        ((u.uprops[0x23].intrinsic == 0 ||
         ((u.uprops[0x24].extrinsic != 0 ||
          ((u.umonnum != u.umonster && (bVar7 = dmgtype(youmonst.data,0x24), bVar7 != '\0'))))))))
       && ((u.uprops[0x1b].intrinsic == 0 &&
           ((((u.umonnum != 0x9e && ((youmonst.data)->mlet != '\x1c')) && (flags.forcefight == '\0')
             ) && ((uwep == (obj *)0x0 || (uwep->oartifact != '\x03')))))))) {
      uVar11 = mt_random();
      if (uVar11 * -0x49249249 < 0x24924925) {
        bVar22 = true;
      }
      else {
        ppVar5 = mtmp->data;
        bVar22 = ppVar5 == mons + 0x158 || (ppVar5 == mons + 0x76 || ppVar5 == mons + 0x74);
      }
      pcVar17 = in_rooms(level,mtmp->mx,mtmp->my,0x12);
      cVar9 = *pcVar17;
      while (cVar9 != '\0') {
        pcVar17 = pcVar17 + 1;
        bVar7 = tended_shop((mkroom *)((long)level->monsters + (long)cVar9 * 0xd8 + 0x3358));
        if (bVar7 != '\0') goto LAB_0027395b;
        cVar9 = *pcVar17;
      }
      if ((bVar22) ||
         ((level->locations[u.ux][u.uy].typ < '\x11' && ((mtmp->data->mflags1 & 8) == 0)))) {
LAB_0027395b:
        uVar11 = mt_random();
        monflee(mtmp,uVar11 % 6 + 1,'\0','\0');
        pcVar17 = y_monnam(mtmp);
        strcpy(buf,pcVar17);
        cVar9 = highc(buf[0]);
        buf[0] = cVar9;
        pcVar17 = "You stop.  %s is in the way!";
      }
      else {
        if (((mtmp->mfrozen == '\0') && ((mtmp->field_0x62 & 4) != 0)) &&
           (mtmp->data->mmove != '\0')) {
          return '\0';
        }
        uVar11 = mt_random();
        if ((uVar11 * -0x55555555 >> 1 | (uint)((uVar11 * -0x55555555 & 1) != 0) << 0x1f) <
            0x2aaaaaab) {
          return '\0';
        }
        Monnam(mtmp);
        pcVar17 = "%s doesn\'t seem to move!";
      }
      pline(pcVar17);
      nomul(0,(char *)0x0);
      return '\x01';
    }
  }
LAB_0027187f:
  override_confirmation = 0;
  bVar7 = attack_checks(mtmp,uwep,dx,dy,'\0');
  if (bVar7 != '\0') {
    return '\x01';
  }
  local_1d0[0] = (int)dy;
  local_1d0[1] = (int)dx;
  if ((u.umonnum == u.umonster) || (iVar10 = noattacks(youmonst.data), iVar10 == 0)) {
    bVar7 = check_capacity("You cannot fight while so heavily loaded.");
    if (bVar7 == '\0') {
      if ((u.twoweap != '\0') && (iVar10 = can_twoweapon(), iVar10 == 0)) {
        untwoweapon();
      }
      if ((unweapon != '\0') && (unweapon = '\0', flags.verbose != '\0')) {
        if (uwep == (obj *)0x0) {
          if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0')) {
            pcVar17 = "bash";
            if (urole.malenum == 0x160) {
              pcVar17 = "strik";
            }
            pcVar23 = "gloved";
            if (uarmg == (obj *)0x0) {
              pcVar23 = "bare";
            }
            pcVar18 = body_part(6);
            pcVar18 = makeplural(pcVar18);
            pline("You begin %sing monsters with your %s %s.",pcVar17,pcVar23,pcVar18);
          }
        }
        else {
          pcVar17 = aobjnam(uwep,(char *)0x0);
          pline("You begin bashing monsters with your %s.",pcVar17);
        }
      }
      exercise(0,'\x01');
      u_wipe_engr(3);
      if ((((ppVar5->mlet == '\f') && (mtmp->mfrozen == '\0')) &&
          ((*(uint *)&mtmp->field_0x60 & 0x2a0000) == 0x20000)) &&
         (uVar11 = mt_random(), uVar11 * -0x49249249 < 0x24924925)) {
        iVar10 = m_move(mtmp,0);
        if (iVar10 == 2) {
          return '\0';
        }
        if ((u.ux + local_1d0[1] != (int)mtmp->mx) || (u.uy + local_1d0[0] != (int)mtmp->my)) {
          return '\0';
        }
      }
      sVar8 = find_roll_to_hit(mtmp);
      iVar6 = u.umonnum;
      iVar10 = u.umonster;
      local_1d4 = (int)sVar8;
      if ((u.umonnum != u.umonster) || (urace.malenum == 0xe8)) {
        dhit = 0;
        pmVar24 = (monst *)0x0;
        do {
          sum[(long)pmVar24] = 0;
          paVar19 = getmattk(youmonst.data,(int)pmVar24,sum,&alt_attk);
          uVar27 = paVar19->aatyp;
          switch(uVar27) {
          case '\0':
          case '\x0e':
            goto switchD_00271d61_caseD_0;
          case '\x01':
            if ((((uwep != (obj *)0x0 && pmVar24 == (monst *)0x0) &&
                 (((youmonst.data)->mflags1 & 0x2000) == 0)) && ((youmonst.data)->msize != '\0')) ||
               ((pmVar24 == (monst *)0x1 && uwep != (obj *)0x0 && (u.umonnum - 0x12fU < 2))))
            goto LAB_00272406;
          case '\x02':
            if ((((pmVar24 == (monst *)0x0) ||
                 ((((((youmonst.data)->mlet != '0' && (((youmonst.data)->mflags2 & 0x100) == 0)) ||
                    (u.uprops[0x1b].intrinsic != 0)) ||
                   ((u.umonnum == 0x9e || ((youmonst.data)->mlet == '\x1c')))) ||
                  (u.uprops[0x1c].intrinsic != 0)))) ||
                (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
                 ((u.umonnum == u.umonster || (bVar7 = dmgtype(youmonst.data,0x24), bVar7 == '\0')))
                 ))) || (ppVar5 = mtmp->data,
                        (ppVar5 != mons + 299 && ppVar5 != mons + 0xd7) &&
                        ((ppVar5 != mons + 0x127 && (ppVar5 != mons + 0xb && ppVar5 != mons + 0xc))
                        && ((ppVar5 != mons + 0xdb && ppVar5 != mons + 0x145) &&
                           (ppVar5 != mons + 0x146 && ppVar5 != mons + 0x144))))) {
switchD_00271d61_caseD_3:
              if ((uwep == (obj *)0x0 || pmVar24 != (monst *)0x0) || ((youmonst.data)->mlet != '&'))
              {
                if (((uwep == (obj *)0x0) && ((u.twoweap == '\0' || (uswapwep == (obj *)0x0)))) ||
                   (ppVar5 = mtmp->data,
                   ppVar5 != mons + 0x127 && (ppVar5 != mons + 0xb && ppVar5 != mons + 0xc))) {
switchD_00271d61_caseD_10:
                  if (((pmVar24 == (monst *)0x0) && (uwep != (obj *)0x0)) &&
                     ((youmonst.data)->mlet == '&')) goto LAB_00272406;
                  if ((((((u.umonnum == 0x9e || u.uprops[0x1b].intrinsic != 0) ||
                          youmonst.data != mons + 0x32 && youmonst.data != mons + 0x31) ||
                        ((youmonst.data)->mlet == '\x1c')) || (u.uprops[0x1c].intrinsic != 0)) ||
                      (((u.uprops[0x23].intrinsic != 0 && (u.uprops[0x24].extrinsic == 0)) &&
                       ((u.umonnum == u.umonster ||
                        (bVar7 = dmgtype(youmonst.data,0x24), bVar7 == '\0')))))) ||
                     (ppVar5 = mtmp->data,
                     (ppVar5 != mons + 299 && ppVar5 != mons + 0xd7) &&
                     ((ppVar5 != mons + 0x127 && (ppVar5 != mons + 0xb && ppVar5 != mons + 0xc)) &&
                     ((ppVar5 != mons + 0xdb && ppVar5 != mons + 0x145) &&
                     (ppVar5 != mons + 0x146 && ppVar5 != mons + 0x144))))) {
                    uVar11 = mt_random();
                    iVar15 = uVar11 % 0x14 + 1;
                    dhit = (byte)(iVar15 < local_1d4 | u._1052_1_) & 1;
                    if (iVar15 < local_1d4 || (u._1052_1_ & 1) != 0) {
                      if (((u._1052_1_ & 1) == 0) &&
                         (iVar15 = could_seduce(&youmonst,mtmp,paVar19), iVar15 != 0)) {
                        pcVar17 = "talk to";
                        if (((mtmp->field_0x62 & 2) != 0) &&
                           (pcVar17 = "talk to", (mtmp->data->mflags1 & 0x1000) == 0)) {
                          pcVar17 = "smile at";
                        }
                        pcVar23 = mon_nam(mtmp);
                        pcVar18 = "seductively";
                        if (iVar15 == 2) {
                          pcVar18 = "engagingly";
                        }
                        pline("You %s %s %s.",pcVar17,pcVar23,pcVar18);
                        iVar15 = damageum(mtmp,paVar19);
                        sum[(long)pmVar24] = iVar15;
                      }
                      else {
                        wakeup(mtmp);
                        if ((mtmp->data == mons + 299) &&
                           ((uarmf == (obj *)0x0 || paVar19->aatyp != '\x03' ||
                            ((uarmf->field_0x4a & 2) == 0)))) {
                          pcVar17 = mon_nam(mtmp);
                          pcVar23 = "Your attack passes harmlessly through %s.";
LAB_00272704:
                          pline(pcVar23,pcVar17);
                        }
                        else {
                          uVar27 = paVar19->aatyp;
                          pcVar17 = mon_nam(mtmp);
                          bVar25 = uVar27 - 2;
                          pcVar23 = "You hit %s.";
                          if (bVar25 < 0xf) {
                            pcVar23 = &DAT_002d6724 + *(int *)(&DAT_002d6724 + (ulong)bVar25 * 4);
                          }
                          pline(pcVar23,pcVar17);
                          if (((mtmp->data != mons + 0xdb) || ((mtmp->field_0x61 & 1) != 0)) ||
                             (mtmp->mhp < 2)) goto LAB_00272883;
                          uVar27 = paVar19->aatyp;
                          if (uarmf == (obj *)0x0 || uVar27 != '\x03') {
                            if ((uarmg == (obj *)0x0) ||
                               (((uVar27 != '\x01' && (uVar27 != 0xfe)) && (uVar27 != '\x05')))) {
                              if (uarmh == (obj *)0x0 || uVar27 != '\x04') {
                                pcVar17 = mons_mname(mons + 0xdb);
                                pcVar17 = an(pcVar17);
                                uVar11 = 0;
                                sprintf(buf,"touching %s",pcVar17);
                                iVar15 = instadisintegrate(buf);
                                mtmp->mhp = mtmp->mhp - iVar15;
                              }
                              else {
                                uVar11 = 0;
                                if (((objects[uarmh->otyp].oc_oprop != '\x04') &&
                                    (bVar7 = obj_resists(uarmh,5,0x32), bVar7 == '\0')) &&
                                   (bVar7 = is_quest_artifact(uarmh), bVar7 == '\0')) {
                                  ppoVar20 = &uarmh;
                                  goto LAB_002729c6;
                                }
                              }
                            }
                            else {
                              uVar11 = 0;
                              if (((objects[uarmg->otyp].oc_oprop != '\x04') &&
                                  (bVar7 = obj_resists(uarmg,5,0x32), bVar7 == '\0')) &&
                                 (bVar7 = is_quest_artifact(uarmg), bVar7 == '\0')) {
                                ppoVar20 = &uarmg;
                                goto LAB_002729c6;
                              }
                            }
                          }
                          else {
                            uVar11 = 0;
                            if (((objects[uarmf->otyp].oc_oprop != '\x04') &&
                                (bVar7 = obj_resists(uarmf,5,0x32), uVar11 = 0, bVar7 == '\0')) &&
                               (bVar7 = is_quest_artifact(uarmf), bVar7 == '\0')) {
                              ppoVar20 = &uarmf;
LAB_002729c6:
                              uVar11 = (*ppoVar20)->owt;
                              destroy_arm(*ppoVar20,'\0');
                            }
                          }
                          sum[(long)pmVar24] = 1;
                          if (uVar11 == 0) {
                            uVar11 = 0;
                          }
                          else {
                            uVar28 = (ulong)uVar11 / 100;
                            if ((int)uVar11 < 0x65) {
                              uVar28 = 1;
                            }
                            uVar11 = mt_random();
                            uVar11 = (uint)((ulong)uVar11 % uVar28);
                            if (4 < uVar11) {
                              uVar11 = 5;
                            }
                            uVar11 = ~uVar11;
                          }
                          iVar15 = uVar11 + mtmp->mhp;
                          if (iVar15 < 2) {
                            iVar15 = 1;
                          }
                          mtmp->mhp = iVar15;
                        }
                      }
                    }
                    else {
LAB_002723c0:
                      missum(mtmp,paVar19);
                    }
                  }
                }
              }
              else {
LAB_00272406:
                local_1e0 = pmVar24;
                iVar13 = hitval(uwep,mtmp);
                iVar14 = weapon_hit_bonus(uwep);
                iVar15 = local_1d4;
                iVar14 = iVar13 + local_1d4 + iVar14;
                uVar11 = mt_random();
                dieroll = uVar11 % 0x14 + 1;
                dhit = (byte)(dieroll < iVar14 | u._1052_1_) & 1;
                local_1d4 = iVar15;
                if (uwep == (obj *)0x0) {
                  local_1d4 = iVar14;
                }
                bVar7 = known_hitum(mtmp,&dhit,paVar19,(schar)local_1d0[1],(schar)local_1d0[0]);
                pmVar24 = local_1e0;
                if (bVar7 == '\0') {
                  sum[(long)local_1e0] = 2;
                }
                else {
                  sum[(long)local_1e0] = dhit;
                  pmVar21 = level->monsters[(long)u.ux + (long)dx][(long)u.uy + (long)dy];
                  if (pmVar21 == (monst *)0x0) {
                    pmVar21 = (monst *)0x0;
                  }
                  else if ((pmVar21->field_0x61 & 2) != 0) {
                    pmVar21 = (monst *)0x0;
                  }
                  if (pmVar21 != mtmp) goto LAB_002735bb;
                  if (((dhit != 0) && (paVar19->adtyp != '\0')) && (paVar19->adtyp != 0xf1)) {
LAB_00272883:
                    iVar15 = damageum(mtmp,paVar19);
                    sum[(long)pmVar24] = iVar15;
                  }
                }
              }
            }
            break;
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
            goto switchD_00271d61_caseD_3;
          case '\a':
            dhit = 1;
            wakeup(mtmp);
            if (mtmp->data == mons + 299) {
              pcVar17 = mon_nam(mtmp);
              pcVar23 = "Your hug passes harmlessly through %s.";
              goto LAB_00272704;
            }
            bVar7 = sticks(mtmp->data);
            if ((bVar7 != '\0') || ((u._1052_1_ & 1) != 0)) break;
            if (u.ustuck == mtmp) {
              pcVar17 = Monnam(mtmp);
              pcVar23 = "crushed";
              if (u.umonnum == 0x102) {
                pcVar23 = "choked";
              }
              pline("%s is being %s.",pcVar17,pcVar23);
            }
            else {
              if (((pmVar24 < (monst *)0x2) || (sum[(long)&pmVar24[-1].field_0x77] == 0)) ||
                 (local_1d0[(long)pmVar24] == 0)) break;
              pcVar17 = mon_nam(mtmp);
              pline("You grab %s!",pcVar17);
              u.ustuck = mtmp;
            }
            goto LAB_00272883;
          case '\b':
          case '\t':
switchD_00271d61_caseD_8:
            warning("strange attack of yours (%d)");
            break;
          case '\n':
          case '\f':
          case '\x0f':
            dhit = 0;
            break;
          case '\v':
            uVar11 = mt_random();
            iVar15 = uVar11 % ((int)pmVar24 + 0x14U) + 1;
            dhit = (int)(iVar15 < local_1d4);
            if (iVar15 < local_1d4) {
              wakeup(mtmp);
              if (mtmp->data == mons + 299) {
                pcVar17 = mon_nam(mtmp);
                pcVar23 = "Your attempt to surround %s is harmless.";
                goto LAB_00272704;
              }
              bVar25 = paVar19->damn;
              uVar11 = (uint)bVar25;
              if (bVar25 != 0) {
                bVar3 = paVar19->damd;
                uVar26 = (uint)bVar25;
                do {
                  uVar12 = mt_random();
                  uVar11 = uVar11 + uVar12 % (uint)bVar3;
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
              }
              if (mtmp->data->msize < 4) {
                if ((0x5db < u.uhunger) || ((u._1052_1_ & 1) != 0)) goto LAB_0027307e;
                for (poVar16 = mtmp->minvent; poVar16 != (obj *)0x0; poVar16 = poVar16->nobj) {
                  snuff_lit(poVar16);
                }
                ppVar5 = mtmp->data;
                if ((((ppVar5 == mons + 0xc) || (ppVar5 == mons + 0xb)) &&
                    (u.uprops[8].extrinsic == 0)) && (((byte)youmonst.mintrinsics & 0x80) == 0)) {
                  pcVar17 = mon_nam(mtmp);
                  pline("You bite into %s.",pcVar17);
                  pcVar17 = mons_mname(mtmp->data);
                  pcVar17 = an(pcVar17);
                  sprintf(buf,"swallowing %s whole",pcVar17);
                  delayed_petrify((char *)0x0,buf);
                  goto LAB_0027307e;
                }
                if (((ppVar5 == mons + 0xdb) &&
                    (((u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0 &&
                      (((byte)youmonst.mintrinsics & 8) == 0)) ||
                     (((u.uprops[4].intrinsic >> 0x1a & 1) != 0 &&
                      (((u.uprops[4].intrinsic & 0xfbffffff) == 0 && u.uprops[4].extrinsic == 0 &&
                       (((byte)youmonst.mintrinsics & 8) == 0)))))))) &&
                   (((u.uprops[4].intrinsic >> 0x1a & 1) == 0 ||
                    ((((u.uprops[4].intrinsic & 0xfbffffff) != 0 || u.uprops[4].extrinsic != 0 ||
                      (((byte)youmonst.mintrinsics & 8) != 0)) ||
                     (uVar26 = mt_random(),
                     (uVar26 * -0x33333333 >> 1 | (uint)((uVar26 * -0x33333333 & 1) != 0) << 0x1f) <
                     0x1999999a)))))) {
                  pcVar17 = mon_nam(mtmp);
                  pline("You bite into %s.",pcVar17);
                  pcVar17 = mons_mname(mtmp->data);
                  pcVar17 = an(pcVar17);
                  sprintf(buf,"swallowing %s whole",pcVar17);
                  instadisintegrate(buf);
                  goto LAB_0027307e;
                }
                if ((((youmonst.data != mons + 0x7b && youmonst.data != mons + 0x9e) &&
                      (u.uprops[0xd].extrinsic == 0 && u.uprops[0xd].intrinsic == 0)) ||
                    (u.uprops[0xd].blocked != 0)) ||
                   ((u.uprops[0xc].intrinsic != 0 ||
                    ((u.uprops[0xc].extrinsic != 0 || (((youmonst.data)->mflags1 & 0x1000000) != 0))
                    )))) {
                  local_1e0 = (monst *)CONCAT44(local_1e0._4_4_,(int)mtmp->mx);
                  cVar9 = mtmp->my;
                  map_location((int)u.ux,(int)u.uy,1);
                  lev = level;
                  if ((u.uprops[0x23].intrinsic == 0) ||
                     ((u.uprops[0x24].extrinsic != 0 ||
                      ((u.umonnum != u.umonster &&
                       (bVar7 = dmgtype(youmonst.data,0x24), bVar7 != '\0')))))) {
                    iVar15 = (int)youmonst.mnum;
                  }
                  else {
                    iVar15 = display_rng(0x193);
                  }
                  dbuf_set(lev,(int)local_1e0,(int)cVar9,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,iVar15 + 1,0,
                           0);
                }
                pcVar17 = mon_nam(mtmp);
                pline("You engulf %s!",pcVar17);
                (*windowprocs.win_delay)();
                (*windowprocs.win_delay)();
                ppVar5 = youmonst.data;
                switch(paVar19->adtyp) {
                case '\0':
                  pcVar17 = Monnam(mtmp);
                  if (ppVar5 == mons + 0x6e) {
                    pline("%s is laden with your moisture.",pcVar17);
                    ppVar5 = mtmp->data;
                    if ((ppVar5 != mons + 0x157 &&
                        (ppVar5 != mons + 0xa0 && (ppVar5 != mons + 0x20 && ppVar5 != mons + 0x73)))
                        && (ppVar5->mflags1 & 0x600) != 0) {
                      pcVar17 = Monnam(mtmp);
                      pcVar23 = "%s seems unharmed.";
                      goto LAB_00273196;
                    }
                  }
                  else {
                    pline("%s is pummeled with your debris!",pcVar17);
                  }
                  break;
                case '\x01':
                case '\x04':
                case '\x05':
                case '\a':
                case '\t':
                case '\n':
                  break;
                case '\x02':
                  uVar26 = mt_random();
                  if ((uVar26 & 1) == 0) goto LAB_00272efc;
                  uVar4 = mtmp->mintrinsics;
                  pcVar23 = Monnam(mtmp);
                  uVar4 = uVar4 & 1;
                  pcVar17 = "%s seems mildly hot.";
                  pcVar18 = "%s is burning to a crisp!";
LAB_00272fae:
                  if (uVar4 == 0) {
                    pcVar17 = pcVar18;
                  }
                  if (uVar4 != 0) {
                    uVar11 = 0;
                  }
                  pline(pcVar17,pcVar23);
                  golemeffects(mtmp,(uint)paVar19->adtyp,uVar11);
                  break;
                case '\x03':
                  uVar26 = mt_random();
                  if ((uVar26 & 1) != 0) {
                    uVar4 = mtmp->mintrinsics;
                    pcVar23 = Monnam(mtmp);
                    uVar4 = uVar4 & 2;
                    pcVar17 = "%s seems mildly chilly.";
                    pcVar18 = "%s is freezing to death!";
                    goto LAB_00272fae;
                  }
LAB_00272efc:
                  uVar11 = 0;
                  break;
                case '\x06':
                  uVar26 = mt_random();
                  if ((uVar26 & 1) == 0) goto LAB_00272ee7;
                  pcVar17 = mon_nam(mtmp);
                  pline("The air around %s crackles with electricity.",pcVar17);
                  if ((mtmp->mintrinsics & 0x10) != 0) {
                    pcVar17 = Monnam(mtmp);
                    uVar11 = 0;
                    pline("%s seems unhurt.",pcVar17);
                  }
                  golemeffects(mtmp,(uint)paVar19->adtyp,uVar11);
                  break;
                case '\b':
                  pcVar17 = Monnam(mtmp);
                  pline("%s is covered with your goo!",pcVar17);
                  if ((mtmp->mintrinsics & 0x40) != 0) {
                    pcVar17 = mon_nam(mtmp);
                    pcVar23 = "It seems harmless to %s.";
LAB_00273196:
                    uVar11 = 0;
                    pline(pcVar23,pcVar17);
                  }
                  break;
                case '\v':
                  bVar7 = can_blnd(&youmonst,mtmp,paVar19->aatyp,(obj *)0x0);
                  if (bVar7 != '\0') {
                    if ((mtmp->field_0x62 & 2) != 0) {
                      pcVar17 = Monnam(mtmp);
                      pline("%s can\'t see in there!",pcVar17);
                    }
                    mtmp->field_0x62 = mtmp->field_0x62 & 0xfd;
                    iVar15 = uVar11 + mtmp->mblinded;
                    if (0x7e < iVar15) {
                      iVar15 = 0x7f;
                    }
                    mtmp->mblinded = (uchar)iVar15;
                  }
LAB_00272ee7:
                  uVar11 = 0;
                  break;
                default:
                  if (paVar19->adtyp != '\x1a') break;
                  ppVar5 = mtmp->data;
                  local_1e0 = mtmp;
                  if (ppVar5 == mons + 0x145 || (ppVar5 == mons + 0x146 || ppVar5 == mons + 0x144))
                  {
                    pline("Unfortunately, digesting any of it is fatal.");
                    mtmp = local_1e0;
                    end_engulf(local_1e0);
                    pcVar17 = mons_mname(mtmp->data);
                    sprintf(gulpum_msgbuf,"unwisely tried to eat %s",pcVar17);
                    killer = gulpum_msgbuf;
                    killer_format = 2;
                    done(0);
                    goto LAB_0027307e;
                  }
                  if (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0) {
                    uVar11 = 0;
                    break;
                  }
                  bVar25 = ppVar5->mlet;
                  uVar28 = (ulong)bVar25;
                  if (uVar28 < 0x21) {
                    if ((0x102400404U >> (uVar28 & 0x3f) & 1) == 0) {
                      if ((uVar28 != 0x1f) || (ppVar5 == mons + 0x9e)) goto LAB_00273355;
                      goto LAB_002733ab;
                    }
LAB_002731f3:
                    iVar15 = 5;
                  }
                  else {
LAB_00273355:
                    if ((ppVar5 != mons + 0x104 && ppVar5 != mons + 0x106) && bVar25 == 0x37) {
LAB_002733ab:
                      if ((0x20 < bVar25) ||
                         (((0x102400404U >> (uVar28 & 0x3f) & 1) == 0 &&
                          ((uVar28 != 0x1f || (ppVar5 == mons + 0x9e)))))) {
LAB_002733d7:
                        if ((bVar25 != 0x36) &&
                           (iVar15 = 6,
                           (ppVar5 == mons + 0x106 || ppVar5 == mons + 0x104) || bVar25 != 0x37))
                        goto LAB_002731f8;
                      }
                      goto LAB_002731f3;
                    }
                    if (bVar25 == 0x36) goto LAB_002733d7;
                    iVar15 = 7;
                    if ((bVar25 == 0x2a) && (ppVar5 != mons + 0xd6)) goto LAB_002733ab;
                  }
LAB_002731f8:
                  violated(iVar15);
                  poVar16 = mlifesaver(local_1e0);
                  if (poVar16 != (obj *)0x0) {
                    m_useup(local_1e0,poVar16);
                  }
                  newuhs('\0');
                  pmVar21 = local_1e0;
                  xkilled(local_1e0,2);
                  if (pmVar21->mhp < 1) {
                    bVar25 = *(byte *)((long)&local_1e0->data->cwt + 1);
                    bVar7 = corpse_chance(local_1e0,&youmonst,'\x01');
                    iVar15 = 0;
                    if ((bVar7 != '\0') &&
                       (iVar13 = monsndx(local_1e0->data), (mvitals[iVar13].mvflags & 0x10) == 0)) {
                      iVar15 = bVar25 + 1;
                      u.uhunger = u.uhunger + (local_1e0->data->cnutrit + 1 >> 1);
                    }
                    pcVar17 = mon_nam(local_1e0);
                    sprintf(gulpum_msgbuf,"You totally digest %s.",pcVar17);
                    if (iVar15 == 0) {
                      pline("%s",gulpum_msgbuf);
                    }
                    else {
                      pcVar17 = mon_nam(local_1e0);
                      pline("You digest %s.",pcVar17);
                      nomul(-(iVar15 <<
                             (u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0)),
                            "digesting something");
                      nomovemsg = gulpum_msgbuf;
                    }
                    if (local_1e0->data == mons + 0xd7) {
                      pcVar17 = mons_mname(mons + 0xd7);
                      pcVar17 = The(pcVar17);
                      sprintf(gulpum_msgbuf,"%s isn\'t sitting well with you.",pcVar17);
                      if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
                        u.uprops[0x3a].intrinsic = 5;
                        iflags.botl = '\x01';
                      }
                    }
                    else {
                      exercise(4,'\x01');
                    }
                  }
                  else {
                    pcVar17 = body_part(0x12);
                    pline("You hurriedly regurgitate the sizzling in your %s.",pcVar17);
                  }
                  mtmp = local_1e0;
                  end_engulf(local_1e0);
                  goto LAB_002734c6;
                }
                end_engulf(mtmp);
                piVar1 = &mtmp->mhp;
                iVar15 = *piVar1;
                *piVar1 = *piVar1 - uVar11;
                if ((*piVar1 == 0 || SBORROW4(iVar15,uVar11) != *piVar1 < 0) &&
                   (killed(mtmp), mtmp->mhp < 1)) {
LAB_002734c6:
                  sum[(long)pmVar24] = 2;
                  cVar9 = mtmp->data->mlet;
                  if (((cVar9 == '4') || (cVar9 == '\'')) &&
                     ((((uVar11 = mt_random(), 0x33333333 < uVar11 * -0x33333333 &&
                        (u.uprops[0x34].intrinsic == 0)) &&
                       (youmonst.data != mons + 0xfd && (youmonst.data)->mlet != ' ')) &&
                      (bVar7 = defends(0x21,uwep), bVar7 == '\0')))) {
                    pcVar17 = "very ";
                    if (u.uprops[0x1d].intrinsic == 0) {
                      pcVar17 = "";
                    }
                    pline("You feel %ssick.",pcVar17);
                    uVar11 = mt_random();
                    mdamageu(mtmp,(uVar11 & 7) + 1);
                  }
                  break;
                }
                pcVar17 = "regurgitate";
                if (((youmonst.data)->mflags1 >> 0x12 & 1) == 0) {
                  pcVar17 = "expel";
                }
                pcVar23 = mon_nam(mtmp);
                pline("You %s %s!",pcVar17,pcVar23);
                if ((u.uprops[0x3f].extrinsic != 0 || u.uprops[0x3f].intrinsic != 0) ||
                   (((youmonst.data)->mflags1 & 0x40000) != 0)) {
                  pcVar17 = mon_nam(mtmp);
                  pcVar17 = s_suffix(pcVar17);
                  pline("Obviously, you didn\'t like %s taste.",pcVar17);
                }
              }
              else {
                pcVar17 = Monnam(mtmp);
                pline("%s is too large to be engulfed.",pcVar17);
              }
LAB_0027307e:
              sum[(long)pmVar24] = 0;
              break;
            }
            goto LAB_002723c0;
          case '\r':
            dhit = -1;
            wakeup(mtmp);
            uVar11 = (uint)paVar19->damn;
            if (paVar19->damn != 0) {
              bVar25 = paVar19->damd;
              uVar26 = uVar11;
              do {
                uVar12 = mt_random();
                uVar11 = uVar11 + uVar12 % (uint)bVar25;
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
            }
            pline("You explode!");
            iVar15 = 1;
            switch(paVar19->adtyp) {
            case '\x02':
              bVar25 = (byte)mtmp->mintrinsics;
              break;
            case '\x03':
              bVar25 = (byte)mtmp->mintrinsics >> 1;
              break;
            case '\x04':
            case '\x05':
            case '\a':
            case '\b':
            case '\t':
            case '\n':
              goto switchD_00272171_caseD_4;
            case '\x06':
              bVar25 = (byte)mtmp->mintrinsics >> 4;
              break;
            case '\v':
              bVar7 = resists_blnd(mtmp);
              if (bVar7 == '\0') {
                pcVar17 = Monnam(mtmp);
                pline("%s is blinded by your flash of light!",pcVar17);
                iVar13 = uVar11 + mtmp->mblinded;
                uVar27 = (uchar)iVar13;
                if (0x7e < iVar13) {
                  uVar27 = '\x7f';
                }
                mtmp->mblinded = uVar27;
                mtmp->field_0x62 = mtmp->field_0x62 & 0xfd;
              }
              goto switchD_00272171_caseD_4;
            default:
              if ((paVar19->adtyp != '$') || ((mtmp->data->mflags1 & 0x1000) != 0))
              goto switchD_00272171_caseD_4;
              if ((mtmp->field_0x62 & 2) != 0) {
                pcVar17 = Monnam(mtmp);
                pline("%s is affected by your flash of light!",pcVar17);
                mtmp->field_0x62 = mtmp->field_0x62 | 0x20;
              }
              goto LAB_00272838;
            }
            if ((bVar25 & 1) == 0) {
              pcVar17 = Monnam(mtmp);
              pline("%s gets blasted!",pcVar17);
              piVar1 = &mtmp->mhp;
              iVar13 = *piVar1;
              *piVar1 = *piVar1 - uVar11;
              if (*piVar1 == 0 || SBORROW4(iVar13,uVar11) != *piVar1 < 0) {
                killed(mtmp);
                iVar15 = 2;
              }
            }
            else {
              shieldeff(mtmp->mx,mtmp->my);
              if (mtmp->data->mlet == '7') {
                golemeffects(mtmp,(uint)paVar19->adtyp,uVar11);
              }
              else {
                pcVar17 = mon_nam(mtmp);
                pline("The blast doesn\'t seem to affect %s.",pcVar17);
              }
switchD_00272171_caseD_4:
            }
LAB_00272838:
            sum[(long)pmVar24] = iVar15;
            break;
          case '\x10':
            goto switchD_00271d61_caseD_10;
          default:
            if (uVar27 == 0xff) {
              if (((pmVar24 != (monst *)0x0) || (0x21 < (ulong)(byte)(youmonst.data)->mlet)) ||
                 ((0x200008800U >> ((ulong)(byte)(youmonst.data)->mlet & 0x3f) & 1) == 0))
              goto switchD_00271d61_caseD_0;
            }
            else if (uVar27 != 0xfe) goto switchD_00271d61_caseD_8;
            goto LAB_00272406;
          }
          if (dhit == -1) {
            u.mh = -1;
            rehumanize();
          }
          if (sum[(long)pmVar24] == 2) {
            passive(mtmp,'\x01',0,paVar19->aatyp);
            goto LAB_002735bb;
          }
          passive(mtmp,(boolean)sum[(long)pmVar24],1,paVar19->aatyp);
          if (((u.umonnum != u.umonster) != (iVar6 != iVar10)) || (multi < 0)) goto LAB_002735bb;
switchD_00271d61_caseD_0:
          pmVar24 = (monst *)((long)&pmVar24->nmon + 1);
          if (pmVar24 == (monst *)0x6) goto LAB_002735bb;
        } while( true );
      }
      paVar19 = (youmonst.data)->mattk;
      uVar11 = mt_random();
      dieroll = uVar11 % 0x14 + 1;
      buf._0_4_ = (byte)(dieroll < local_1d4 | u._1052_1_) & 1;
      if (dieroll < local_1d4) {
        exercise(3,'\x01');
      }
      bVar7 = known_hitum(mtmp,(int *)buf,paVar19,(schar)local_1d0[1],(schar)local_1d0[0]);
      passive(mtmp,buf[0],(int)bVar7,0xfe);
      goto LAB_002735bb;
    }
  }
  else {
    pline("You have no way to attack monsters physically.");
LAB_002735bb:
    pbVar2 = (byte *)((long)&mtmp->mstrategy + 3);
    *pbVar2 = *pbVar2 & 0xcf;
  }
  if (flags.forcefight == '\0') {
    return '\x01';
  }
  if (mtmp->mhp < 1) {
    return '\x01';
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) &&
       (((((u.uprops[0x1e].intrinsic != 0 || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed))))
          || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
        (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mtmp->my][mtmp->mx] & 1U) == 0 || ((mtmp->data->mflags3 & 0x200) == 0))))))))
    goto LAB_002736f4;
  }
  else {
    bVar7 = worm_known(level,mtmp);
    if (bVar7 == '\0') goto LAB_002736f4;
  }
  uVar11 = *(uint *)&mtmp->field_0x60;
  if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar11 & 0x280) != 0) goto LAB_002736f4;
  }
  else if (((uVar11 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_002736f4;
  if ((u._1052_1_ & 0x20) == 0) {
    return '\x01';
  }
LAB_002736f4:
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar16 = which_armor(mtmp,4), poVar16 != (obj *)0x0 &&
        (poVar16 = which_armor(mtmp,4), poVar16->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar10 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar10)))))) &&
     (((((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        (bVar7 = match_warn_of_mon(mtmp), bVar7 == '\0')) &&
       ((level->locations[(long)dx + (long)u.ux][(long)dy + (long)u.uy].field_0x6 & 8) == 0)) &&
      (((u._1052_1_ & 1) == 0 || (u.ustuck != mtmp)))))) {
    map_invisible(u.ux + dx,u.uy + dy);
  }
  return '\x01';
}

Assistant:

boolean attack(struct monst *mtmp, schar dx, schar dy)
{
	schar tmp;
	const struct permonst *mdat = mtmp->data;

	/* This section of code provides protection against accidentally
	 * hitting peaceful (like '@') and tame (like 'd') monsters.
	 * Protection is provided as long as player is not: blind, confused,
	 * hallucinating or stunned.
	 * changes by wwp 5/16/85
	 * More changes 12/90, -dkh-. if its tame and safepet, (and protected
	 * 07/92) then we assume that you're not trying to attack. Instead,
	 * you'll usually just swap places if this is a movement command
	 */
	/* Intelligent chaotic weapons (Stormbringer) want blood */
	if (is_safepet(level, mtmp) && !flags.forcefight) {
	    if (!uwep || uwep->oartifact != ART_STORMBRINGER) {
		/* there are some additional considerations: this won't work
		 * if in a shop or you miss a random roll or
		 * if you can walk thru walls and your pet cannot (KAA) or
		 * if your pet is a long worm (unless someone does better).
		 * there's also a chance of displacing a "frozen" monster.
		 * sleeping monsters might magically walk in their sleep.
		 */
		boolean foo = (!rn2(7) || is_longworm(mtmp->data)),
			inshop = FALSE;
		char *p;

		for (p = in_rooms(level, mtmp->mx, mtmp->my, SHOPBASE); *p; p++)
		    if (tended_shop(&level->rooms[*p - ROOMOFFSET])) {
			inshop = TRUE;
			break;
		    }

		if (inshop || foo ||
			(IS_ROCK(level->locations[u.ux][u.uy].typ) &&
					!passes_walls(mtmp->data))) {
		    char buf[BUFSZ];

		    monflee(mtmp, rnd(6), FALSE, FALSE);
		    strcpy(buf, y_monnam(mtmp));
		    buf[0] = highc(buf[0]);
		    pline("You stop.  %s is in the way!", buf);
		    nomul(0, NULL);
		    return TRUE;
		} else if ((mtmp->mfrozen || (! mtmp->mcanmove)
				|| (mtmp->data->mmove == 0)) && rn2(6)) {
		    pline("%s doesn't seem to move!", Monnam(mtmp));
		    nomul(0, NULL);
		    return TRUE;
		} else return FALSE;
	    }
	}

	/* possibly set in attack_checks;
	   examined in known_hitum, called via hitum or hmonas below */
	override_confirmation = FALSE;
	if (attack_checks(mtmp, uwep, dx, dy, FALSE))
	    return TRUE;

	if (Upolyd) {
		/* certain "pacifist" monsters don't attack */
		if (noattacks(youmonst.data)) {
			pline("You have no way to attack monsters physically.");
			mtmp->mstrategy &= ~STRAT_WAITMASK;
			goto atk_done;
		}
	}

	if (check_capacity("You cannot fight while so heavily loaded."))
	    goto atk_done;

	if (u.twoweap && !can_twoweapon())
		untwoweapon();

	if (unweapon) {
	    unweapon = FALSE;
	    if (flags.verbose) {
		if (uwep)
		    pline("You begin bashing monsters with your %s.",
			aobjnam(uwep, NULL));
		else if (!cantwield(youmonst.data))
		    pline("You begin %sing monsters with your %s %s.",
			Role_if (PM_MONK) ? "strik" : "bash",
			uarmg ? "gloved" : "bare",	/* Del Lamb */
			makeplural(body_part(HAND)));
	    }
	}
	exercise(A_STR, TRUE);		/* you're exercising muscles */
	/* andrew@orca: prevent unlimited pick-axe attacks */
	u_wipe_engr(3);

	/* Is the "it died" check actually correct? */
	if (mdat->mlet == S_LEPRECHAUN && !mtmp->mfrozen && !mtmp->msleeping &&
	   !mtmp->mconf && mtmp->mcansee && !rn2(7) &&
	   (m_move(mtmp, 0) == 2 ||			    /* it died */
	   mtmp->mx != u.ux + dx || mtmp->my != u.uy + dy)) /* it moved */
		return FALSE;

	tmp = find_roll_to_hit(mtmp);
	if (Upolyd || Race_if(PM_VAMPIRE))
		hmonas(mtmp, tmp, dx, dy);
	else
		hitum(mtmp, tmp, youmonst.data->mattk, dx, dy);
	mtmp->mstrategy &= ~STRAT_WAITMASK;

atk_done:
	/* see comment in attack_checks() */
	/* we only need to check for this if we did an attack_checks()
	 * and it returned 0 (it's okay to attack), and the monster didn't
	 * evade.
	 */
	if (flags.forcefight && mtmp->mhp > 0 && !canspotmon(level, mtmp) &&
	    !level->locations[u.ux+dx][u.uy+dy].mem_invis &&
	    !(u.uswallow && mtmp == u.ustuck))
		map_invisible(u.ux+dx, u.uy+dy);

	return TRUE;
}